

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O0

void __thiscall dlib::timer<dlib::text_grid>::thread(timer<dlib::text_grid> *this)

{
  element_type *this_00;
  timer_base *r;
  char *in_RDI;
  auto_mutex M;
  mutex *in_stack_ffffffffffffffa8;
  auto_mutex *this_01;
  timer_global_clock *in_stack_ffffffffffffffd0;
  
  this_01 = *(auto_mutex **)(in_RDI + 0xa0);
  r = (timer_base *)(*(long *)(in_RDI + 0x98) + *(long *)(in_RDI + 0xa8));
  if (((ulong)this_01 & 1) != 0) {
    this_01 = *(auto_mutex **)
               ((long)this_01 + (long)(r->super_threaded_object)._vptr_threaded_object + -1);
  }
  (*(code *)this_01)(r);
  std::__shared_ptr_access<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x48ae62);
  auto_mutex::auto_mutex(this_01,in_stack_ffffffffffffffa8);
  if ((in_RDI[0x91] & 1U) != 0) {
    this_00 = std::
              __shared_ptr_access<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x48ae95);
    timer_global_clock::remove(this_00,in_RDI);
    std::__shared_ptr_access<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x48aeb5);
    timer_global_clock::add(in_stack_ffffffffffffffd0,r);
  }
  auto_mutex::~auto_mutex((auto_mutex *)0x48aeea);
  return;
}

Assistant:

void timer<T>::
    thread (
    )
    {
        // call the action function
        (ao.*af)(); 
        auto_mutex M(gc->m);
        if (running)
        {
            gc->remove(this);
            gc->add(this);
        }
    }